

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddDrawListToDrawData(ImVector<ImDrawList_*> *out_list,ImDrawList *draw_list)

{
  bool bVar1;
  ImDrawCmd *pIVar2;
  ImVector<ImDrawCmd> *in_RSI;
  ImDrawCmd *last_cmd;
  ImDrawList **in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffe7;
  
  bVar1 = ImVector<ImDrawCmd>::empty(in_RSI);
  if (!bVar1) {
    pIVar2 = ImVector<ImDrawCmd>::back
                       ((ImVector<ImDrawCmd> *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
    if ((pIVar2->ElemCount == 0) && (pIVar2->UserCallback == (ImDrawCallback)0x0)) {
      ImVector<ImDrawCmd>::pop_back
                ((ImVector<ImDrawCmd> *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
      bVar1 = ImVector<ImDrawCmd>::empty(in_RSI);
      if (bVar1) {
        return;
      }
    }
    bVar1 = true;
    if (in_RSI[2].Size != 0) {
      bVar1 = (uint *)*(undefined1 **)(in_RSI + 5) ==
              &(in_RSI[2].Data)->ElemCount + (long)in_RSI[2].Size * 5;
    }
    if (bVar1 == false) {
      __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0xffe,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    bVar3 = true;
    if (in_RSI[1].Size != 0) {
      bVar3 = in_RSI[5].Data == (ImDrawCmd *)(&(in_RSI[1].Data)->ElemCount + in_RSI[1].Size);
    }
    if (bVar3 == false) {
      __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0xfff,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    if (((in_RSI[3].Size & 4U) == 0) && (*(int *)((long)&in_RSI[4].Data + 4) != in_RSI[2].Size)) {
      __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1001,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    ImVector<ImDrawList_*>::push_back
              ((ImVector<ImDrawList_*> *)CONCAT17(bVar1,CONCAT16(bVar3,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void AddDrawListToDrawData(ImVector<ImDrawList*>* out_list, ImDrawList* draw_list)
{
    if (draw_list->CmdBuffer.empty())
        return;

    // Remove trailing command if unused
    ImDrawCmd& last_cmd = draw_list->CmdBuffer.back();
    if (last_cmd.ElemCount == 0 && last_cmd.UserCallback == NULL)
    {
        draw_list->CmdBuffer.pop_back();
        if (draw_list->CmdBuffer.empty())
            return;
    }

    // Draw list sanity check. Detect mismatch between PrimReserve() calls and incrementing _VtxCurrentIdx, _VtxWritePtr etc.
    // May trigger for you if you are using PrimXXX functions incorrectly.
    IM_ASSERT(draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size);
    IM_ASSERT(draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size);
    if (!(draw_list->Flags & ImDrawListFlags_AllowVtxOffset))
        IM_ASSERT((int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size);

    // Check that draw_list doesn't use more vertices than indexable (default ImDrawIdx = unsigned short = 2 bytes = 64K vertices per ImDrawList = per window)
    // If this assert triggers because you are drawing lots of stuff manually:
    // - First, make sure you are coarse clipping yourself and not trying to draw many things outside visible bounds.
    //   Be mindful that the ImDrawList API doesn't filter vertices. Use the Metrics window to inspect draw list contents.
    // - If you want large meshes with more than 64K vertices, you can either:
    //   (A) Handle the ImDrawCmd::VtxOffset value in your renderer back-end, and set 'io.BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset'.
    //       Most example back-ends already support this from 1.71. Pre-1.71 back-ends won't.
    //       Some graphics API such as GL ES 1/2 don't have a way to offset the starting vertex so it is not supported for them.
    //   (B) Or handle 32-bit indices in your renderer back-end, and uncomment '#define ImDrawIdx unsigned int' line in imconfig.h.
    //       Most example back-ends already support this. For example, the OpenGL example code detect index size at compile-time:
    //         glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
    //       Your own engine or render API may use different parameters or function calls to specify index sizes.
    //       2 and 4 bytes indices are generally supported by most graphics API.
    // - If for some reason neither of those solutions works for you, a workaround is to call BeginChild()/EndChild() before reaching
    //   the 64K limit to split your draw commands in multiple draw lists.
    if (sizeof(ImDrawIdx) == 2)
        IM_ASSERT(draw_list->_VtxCurrentIdx < (1 << 16) && "Too many vertices in ImDrawList using 16-bit indices. Read comment above");

    out_list->push_back(draw_list);
}